

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O3

wchar_t archive_match_set_inclusion_recursion(archive *_a,wchar_t enabled)

{
  int iVar1;
  wchar_t wVar2;
  
  iVar1 = __archive_check_magic(_a,0xcad11c9,1,"archive_match_set_inclusion_recursion");
  wVar2 = L'\xffffffe2';
  if (iVar1 != -0x1e) {
    _a[1].state = enabled;
    wVar2 = L'\0';
  }
  return wVar2;
}

Assistant:

int
archive_match_set_inclusion_recursion(struct archive *_a, int enabled)
{
	struct archive_match *a;

	archive_check_magic(_a, ARCHIVE_MATCH_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_match_set_inclusion_recursion");
	a = (struct archive_match *)_a;
	a->recursive_include = enabled;
	return (ARCHIVE_OK);
}